

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

void Json::StreamWriterBuilder::setDefaults(Value *settings)

{
  Value *pVVar1;
  ValueHolder local_38;
  undefined2 local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  Value::Value((Value *)&local_38,"All");
  pVVar1 = Value::resolveReference(settings,"commentStyle","");
  Value::swap((Value *)&local_38,pVVar1);
  Value::~Value((Value *)&local_38);
  Value::Value((Value *)&local_38,"\t");
  pVVar1 = Value::resolveReference(settings,"indentation","");
  Value::swap((Value *)&local_38,pVVar1);
  Value::~Value((Value *)&local_38);
  local_30 = 5;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  local_38.uint_ = local_38.uint_ & 0xffffffffffffff00;
  pVVar1 = Value::resolveReference(settings,"enableYAMLCompatibility","");
  Value::swap((Value *)&local_38,pVVar1);
  Value::~Value((Value *)&local_38);
  local_30 = 5;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  local_38.uint_ = local_38.uint_ & 0xffffffffffffff00;
  pVVar1 = Value::resolveReference(settings,"dropNullPlaceholders","");
  Value::swap((Value *)&local_38,pVVar1);
  Value::~Value((Value *)&local_38);
  local_30 = 5;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  local_38.uint_ = local_38.uint_ & 0xffffffffffffff00;
  pVVar1 = Value::resolveReference(settings,"useSpecialFloats","");
  Value::swap((Value *)&local_38,pVVar1);
  Value::~Value((Value *)&local_38);
  local_30 = 5;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  local_38.uint_ = local_38.uint_ & 0xffffffffffffff00;
  pVVar1 = Value::resolveReference(settings,"emitUTF8","");
  Value::swap((Value *)&local_38,pVVar1);
  Value::~Value((Value *)&local_38);
  local_30 = 1;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  local_38.int_ = 0x11;
  pVVar1 = Value::resolveReference(settings,"precision","");
  Value::swap((Value *)&local_38,pVVar1);
  Value::~Value((Value *)&local_38);
  Value::Value((Value *)&local_38,"significant");
  pVVar1 = Value::resolveReference(settings,"precisionType","");
  Value::swap((Value *)&local_38,pVVar1);
  Value::~Value((Value *)&local_38);
  return;
}

Assistant:

void StreamWriterBuilder::setDefaults(Json::Value* settings) {
  //! [StreamWriterBuilderDefaults]
  (*settings)["commentStyle"] = "All";
  (*settings)["indentation"] = "\t";
  (*settings)["enableYAMLCompatibility"] = false;
  (*settings)["dropNullPlaceholders"] = false;
  (*settings)["useSpecialFloats"] = false;
  (*settings)["emitUTF8"] = false;
  (*settings)["precision"] = 17;
  (*settings)["precisionType"] = "significant";
  //! [StreamWriterBuilderDefaults]
}